

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# symbolize.cc
# Opt level: O3

int google::OpenObjectFileContainingPcAndGetStartAddress
              (uint64_t pc,uint64_t *start_address,uint64_t *base_address,char *out_file_name,
              int out_file_name_size)

{
  off_t oVar1;
  uint uVar2;
  ulong *puVar3;
  int iVar4;
  int iVar5;
  int *piVar6;
  void *pvVar7;
  char *end;
  char *pcVar8;
  ulong uVar9;
  ssize_t sVar10;
  char *pcVar11;
  int iVar12;
  ulong uVar13;
  char *pcVar14;
  char *pcVar15;
  long lVar16;
  FileDescriptor wrapped_mem_fd;
  FileDescriptor wrapped_maps_fd;
  uint64_t end_address;
  uint64_t file_offset;
  Elf64_Ehdr ehdr;
  char buf [1024];
  FileDescriptor local_508;
  FileDescriptor local_504;
  ulong *local_500;
  off_t local_4f8;
  ulong *local_4f0;
  char *local_4e8;
  uint local_4dc;
  char *local_4d8;
  char *local_4d0;
  uint64_t local_4c8;
  char *local_4c0;
  ulong local_4b8;
  uint64_t local_4b0;
  long local_4a8;
  long local_4a0;
  int local_478 [4];
  short local_468;
  long local_458;
  ushort local_440;
  char local_438 [1032];
  
  local_500 = start_address;
  do {
    iVar4 = open("/proc/self/maps",0);
    local_504.fd_ = iVar4;
    puVar3 = base_address;
    if (-1 < iVar4) goto LAB_0011af47;
    piVar6 = __errno_location();
  } while (*piVar6 == 4);
  iVar4 = -1;
  goto LAB_0011af74;
  while (piVar6 = __errno_location(), puVar3 = local_4f0, *piVar6 == 4) {
LAB_0011af47:
    local_4f0 = puVar3;
    iVar5 = open("/proc/self/mem",0);
    local_508.fd_ = iVar5;
    if (-1 < iVar5) {
      end = local_438;
      local_4f8 = 0;
      pcVar8 = end;
      local_4dc = out_file_name_size;
      local_4d8 = out_file_name;
      local_4c8 = pc;
      goto LAB_0011afbb;
    }
  }
LAB_0011af66:
  iVar4 = -1;
  goto LAB_0011af6c;
LAB_0011afbb:
  do {
    oVar1 = local_4f8;
    if (local_438 == pcVar8) {
      sVar10 = ReadFromOffset(iVar4,local_438,0x400,local_4f8);
      if (sVar10 < 1) goto LAB_0011af66;
      local_4f8 = oVar1 + sVar10;
      pcVar11 = local_438 + sVar10;
      pcVar15 = local_438;
    }
    else {
      pcVar15 = end + 1;
      if (pcVar8 < pcVar15) {
        abort();
      }
      local_4e8 = pcVar8;
      pvVar7 = memchr(pcVar15,10,(long)pcVar8 - (long)pcVar15);
      pcVar11 = local_4e8;
      if (pvVar7 == (void *)0x0) {
        iVar12 = (int)((long)pcVar8 - (long)pcVar15);
        memmove(local_438,pcVar15,(long)iVar12);
        oVar1 = local_4f8;
        sVar10 = ReadFromOffset(iVar4,local_438 + iVar12,(long)(0x400 - iVar12),local_4f8);
        if (sVar10 < 1) goto LAB_0011af66;
        local_4f8 = oVar1 + sVar10;
        pcVar11 = local_438 + iVar12 + sVar10;
        pcVar15 = local_438;
      }
    }
    end = (char *)memchr(pcVar15,10,(long)pcVar11 - (long)pcVar15);
    if (end == (char *)0x0) goto LAB_0011af66;
    *end = '\0';
    pcVar8 = GetHex(pcVar15,end,local_500);
    if ((((pcVar8 == end) || (*pcVar8 != '-')) ||
        (pcVar15 = GetHex(pcVar8 + 1,end,&local_4b8), pcVar15 == end)) ||
       ((*pcVar15 != ' ' || (pcVar8 = pcVar15 + 1, end <= pcVar8)))) goto LAB_0011af66;
    uVar13 = (long)end - (long)pcVar15;
    uVar9 = 1;
    do {
      if (pcVar15[uVar9] == ' ') {
        uVar13 = uVar9;
        pcVar14 = pcVar15 + uVar9;
        break;
      }
      uVar9 = uVar9 + 1;
      pcVar14 = end;
    } while (uVar13 != uVar9);
    if ((uVar13 < 5) || (pcVar14 == end)) goto LAB_0011af66;
    local_4e8 = pcVar11;
    local_4d0 = pcVar14;
    local_4c0 = pcVar8;
    if ((*pcVar8 == 'r') &&
       ((sVar10 = ReadFromOffset(iVar5,local_478,0x40,*local_500), sVar10 == 0x40 &&
        (local_478[0] == 0x464c457f)))) {
      if (local_468 == 2) {
        *local_4f0 = 0;
      }
      else if (local_468 == 3) {
        *local_4f0 = *local_500;
        lVar16 = local_458;
        for (uVar13 = (ulong)local_440; uVar13 != 0; uVar13 = uVar13 - 1) {
          sVar10 = ReadFromOffset(iVar5,&local_4b0,0x38,*local_500 + lVar16);
          if (((sVar10 == 0x38) && ((int)local_4b0 == 1)) && (local_4a8 == 0)) {
            *local_4f0 = *local_500 - local_4a0;
            break;
          }
          lVar16 = lVar16 + 0x38;
        }
      }
    }
    pcVar8 = local_4e8;
  } while (((local_4c8 < *local_500) || (local_4b8 <= local_4c8)) ||
          ((*local_4c0 != 'r' || (pcVar15[3] != 'x'))));
  pcVar11 = GetHex(local_4d0 + 1,end,&local_4b0);
  pcVar8 = local_4d8;
  uVar2 = local_4dc;
  iVar5 = -1;
  iVar4 = iVar5;
  if ((pcVar11 != end) && (*pcVar11 == ' ')) {
    pcVar15 = pcVar11 + 1;
    pcVar14 = pcVar15;
    if (pcVar15 < end) {
      pcVar11 = end + ~(ulong)pcVar11;
      iVar12 = 0;
      do {
        if (*pcVar15 == ' ') {
          iVar12 = iVar12 + 1;
        }
        else {
          pcVar14 = pcVar15;
          if (1 < iVar12) break;
        }
        pcVar15 = pcVar15 + 1;
        pcVar11 = pcVar11 + -1;
        pcVar14 = end;
      } while (pcVar11 != (char *)0x0);
    }
    if (pcVar14 != end) {
      do {
        iVar4 = open(pcVar14,0);
        if (-1 < iVar4) goto LAB_0011af6c;
        piVar6 = __errno_location();
      } while (*piVar6 == 4);
      strncpy(pcVar8,pcVar14,(ulong)uVar2);
      pcVar8[(long)(int)uVar2 + -1] = '\0';
      iVar4 = iVar5;
    }
  }
LAB_0011af6c:
  anon_unknown_3::FileDescriptor::~FileDescriptor(&local_508);
LAB_0011af74:
  anon_unknown_3::FileDescriptor::~FileDescriptor(&local_504);
  return iVar4;
}

Assistant:

static ATTRIBUTE_NOINLINE int
OpenObjectFileContainingPcAndGetStartAddress(uint64_t pc,
                                             uint64_t &start_address,
                                             uint64_t &base_address,
                                             char *out_file_name,
                                             int out_file_name_size) {
  int object_fd;

  int maps_fd;
  NO_INTR(maps_fd = open("/proc/self/maps", O_RDONLY));
  FileDescriptor wrapped_maps_fd(maps_fd);
  if (wrapped_maps_fd.get() < 0) {
    return -1;
  }

  int mem_fd;
  NO_INTR(mem_fd = open("/proc/self/mem", O_RDONLY));
  FileDescriptor wrapped_mem_fd(mem_fd);
  if (wrapped_mem_fd.get() < 0) {
    return -1;
  }

  // Iterate over maps and look for the map containing the pc.  Then
  // look into the symbol tables inside.
  char buf[1024];  // Big enough for line of sane /proc/self/maps
  int num_maps = 0;
  LineReader reader(wrapped_maps_fd.get(), buf, sizeof(buf), 0);
  while (true) {
    num_maps++;
    const char *cursor;
    const char *eol;
    if (!reader.ReadLine(&cursor, &eol)) {  // EOF or malformed line.
      return -1;
    }

    // Start parsing line in /proc/self/maps.  Here is an example:
    //
    // 08048000-0804c000 r-xp 00000000 08:01 2142121    /bin/cat
    //
    // We want start address (08048000), end address (0804c000), flags
    // (r-xp) and file name (/bin/cat).

    // Read start address.
    cursor = GetHex(cursor, eol, &start_address);
    if (cursor == eol || *cursor != '-') {
      return -1;  // Malformed line.
    }
    ++cursor;  // Skip '-'.

    // Read end address.
    uint64_t end_address;
    cursor = GetHex(cursor, eol, &end_address);
    if (cursor == eol || *cursor != ' ') {
      return -1;  // Malformed line.
    }
    ++cursor;  // Skip ' '.

    // Read flags.  Skip flags until we encounter a space or eol.
    const char * const flags_start = cursor;
    while (cursor < eol && *cursor != ' ') {
      ++cursor;
    }
    // We expect at least four letters for flags (ex. "r-xp").
    if (cursor == eol || cursor < flags_start + 4) {
      return -1;  // Malformed line.
    }

    // Determine the base address by reading ELF headers in process memory.
    ElfW(Ehdr) ehdr;
    // Skip non-readable maps.
    if (flags_start[0] == 'r' &&
        ReadFromOffsetExact(mem_fd, &ehdr, sizeof(ElfW(Ehdr)), start_address) &&
        memcmp(ehdr.e_ident, ELFMAG, SELFMAG) == 0) {
      switch (ehdr.e_type) {
        case ET_EXEC:
          base_address = 0;
          break;
        case ET_DYN:
          // Find the segment containing file offset 0. This will correspond
          // to the ELF header that we just read. Normally this will have
          // virtual address 0, but this is not guaranteed. We must subtract
          // the virtual address from the address where the ELF header was
          // mapped to get the base address.
          //
          // If we fail to find a segment for file offset 0, use the address
          // of the ELF header as the base address.
          base_address = start_address;
          for (unsigned i = 0; i != ehdr.e_phnum; ++i) {
            ElfW(Phdr) phdr;
            if (ReadFromOffsetExact(
                    mem_fd, &phdr, sizeof(phdr),
                    start_address + ehdr.e_phoff + i * sizeof(phdr)) &&
                phdr.p_type == PT_LOAD && phdr.p_offset == 0) {
              base_address = start_address - phdr.p_vaddr;
              break;
            }
          }
          break;
        default:
          // ET_REL or ET_CORE. These aren't directly executable, so they don't
          // affect the base address.
          break;
      }
    }

    // Check start and end addresses.
    if (!(start_address <= pc && pc < end_address)) {
      continue;  // We skip this map.  PC isn't in this map.
    }

   // Check flags.  We are only interested in "r*x" maps.
    if (flags_start[0] != 'r' || flags_start[2] != 'x') {
      continue;  // We skip this map.
    }
    ++cursor;  // Skip ' '.

    // Read file offset.
    uint64_t file_offset;
    cursor = GetHex(cursor, eol, &file_offset);
    if (cursor == eol || *cursor != ' ') {
      return -1;  // Malformed line.
    }
    ++cursor;  // Skip ' '.

    // Skip to file name.  "cursor" now points to dev.  We need to
    // skip at least two spaces for dev and inode.
    int num_spaces = 0;
    while (cursor < eol) {
      if (*cursor == ' ') {
        ++num_spaces;
      } else if (num_spaces >= 2) {
        // The first non-space character after skipping two spaces
        // is the beginning of the file name.
        break;
      }
      ++cursor;
    }
    if (cursor == eol) {
      return -1;  // Malformed line.
    }

    // Finally, "cursor" now points to file name of our interest.
    NO_INTR(object_fd = open(cursor, O_RDONLY));
    if (object_fd < 0) {
      // Failed to open object file.  Copy the object file name to
      // |out_file_name|.
      strncpy(out_file_name, cursor, out_file_name_size);
      // Making sure |out_file_name| is always null-terminated.
      out_file_name[out_file_name_size - 1] = '\0';
      return -1;
    }
    return object_fd;
  }
}